

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O0

void earlier_cb(Fl_Widget *param_1,void *param_2)

{
  Fl_Type *pFVar1;
  bool bVar2;
  bool bVar3;
  Fl_Type *local_38;
  Fl_Type *g;
  Fl_Type *nxt;
  Fl_Type *pFStack_20;
  int mod;
  Fl_Type *f;
  void *param_1_local;
  Fl_Widget *param_0_local;
  
  bVar3 = false;
  pFStack_20 = Fl_Type::first;
  pFVar1 = pFStack_20;
  while (pFStack_20 = pFVar1, pFStack_20 != (Fl_Type *)0x0) {
    pFVar1 = pFStack_20->next;
    if (pFStack_20->selected != '\0') {
      local_38 = pFStack_20->prev;
      while( true ) {
        bVar2 = false;
        if (local_38 != (Fl_Type *)0x0) {
          bVar2 = pFStack_20->level < local_38->level;
        }
        if (!bVar2) break;
        local_38 = local_38->prev;
      }
      if (((local_38 != (Fl_Type *)0x0) && (local_38->level == pFStack_20->level)) &&
         (local_38->selected == '\0')) {
        Fl_Type::move_before(pFStack_20,local_38);
        bVar3 = true;
      }
    }
  }
  if (bVar3) {
    set_modflag(1);
  }
  return;
}

Assistant:

void earlier_cb(Fl_Widget*,void*) {
  Fl_Type *f;
  int mod = 0;
  for (f = Fl_Type::first; f; ) {
    Fl_Type* nxt = f->next;
    if (f->selected) {
      Fl_Type* g;
      for (g = f->prev; g && g->level > f->level; g = g->prev) {/*empty*/}
      if (g && g->level == f->level && !g->selected) {
        f->move_before(g);
        mod = 1;
      }
    }
    f = nxt;
  }
  if (mod) set_modflag(1);
}